

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::drawTest
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this,GLint program
          ,int binding)

{
  int height;
  PrimitiveType expected;
  RenderContext *context;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  int *piVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  String *this_00;
  allocator<char> local_a5;
  uint local_a4;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Surface renderedFrame;
  String local_60;
  Vector<float,_4> local_40;
  
  local_a4 = binding;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  lVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var,iVar2) + 8) + 0x18))();
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  piVar5 = (int *)(**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar2) + 8) + 0x20))();
  iVar2 = *piVar5;
  height = piVar5[1];
  tcu::Surface::Surface(&renderedFrame,iVar2,height);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])(this);
  if (iVar3 == 2) {
    deAssertFail("getStage() != ComputeShader",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cLayoutBindingTests.cpp"
                 ,0x4e9);
  }
  (**(code **)(lVar4 + 0x1a00))(0,0,iVar2,height);
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar4 + 0x188))(0x4000);
  (**(code **)(lVar4 + 0x1680))(program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])(this,(ulong)local_a4)
  ;
  if (drawTest(int,int)::vertexArrays == '\0') {
    iVar2 = __cxa_guard_acquire(&drawTest(int,int)::vertexArrays);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"inPosition",(allocator<char> *)&local_60);
      glu::va::Float(drawTest::vertexArrays,(string *)local_a0,2,4,0,drawTest::position);
      std::__cxx11::string::~string((string *)local_a0);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&drawTest(int,int)::vertexArrays);
    }
  }
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  local_a0._0_8_ = &DAT_600000001;
  local_a0._8_4_ = INDEXTYPE_UINT16;
  local_90._M_allocated_capacity = (size_type)drawTest::quadIndices;
  glu::draw(*(RenderContext **)(CONCAT44(extraout_var_01,iVar2) + 8),program,1,
            drawTest::vertexArrays,(PrimitiveList *)local_a0,(DrawUtilCallback *)0x0);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  context = *(RenderContext **)(CONCAT44(extraout_var_02,iVar2) + 8);
  tcu::Surface::getAccess((PixelBufferAccess *)local_a0,&renderedFrame);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_a0);
  expected = *renderedFrame.m_pixels.m_ptr;
  tcu::RGBA::RGBA((RGBA *)local_a0,&this->m_expectedColor);
  uVar1 = local_a0._0_4_;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])(this,(ulong)local_a4)
  ;
  if (expected == uVar1) {
    local_a0._0_8_ = &local_90;
    local_a0._8_8_ = 0;
    local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)local_a0);
    this_00 = (String *)local_a0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"drawTest failed",&local_a5);
    tcu::Vector<float,_4>::Vector(&local_40,&this->m_expectedColor);
    generateLog<tcu::Vector<float,4>,unsigned_int>
              ((String *)local_a0,this,&local_60,&local_40,expected);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    this_00 = &local_60;
  }
  std::__cxx11::string::~string((string *)this_00);
  tcu::Surface::~Surface(&renderedFrame);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::drawTest(glw::GLint program, int binding)
{
	const glw::Functions&	GL			  = getContext().getRenderContext().getFunctions();
	const tcu::RenderTarget& renderTarget = getContext().getRenderContext().getRenderTarget();
	glw::GLuint				 viewportW	= renderTarget.getWidth();
	glw::GLuint				 viewportH	= renderTarget.getHeight();
	tcu::Surface			 renderedFrame(viewportW, viewportH);
	bool					 passed = true;

	DE_TEST_ASSERT(getStage() != ComputeShader);

	GL.viewport(0, 0, viewportW, viewportH);
	GL.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GL.clear(GL_COLOR_BUFFER_BIT);

	static const float position[] = {
		-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
	};
	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	GL.useProgram(program);

	bind(binding);

	static const glu::VertexArrayBinding vertexArrays[] = {
		glu::va::Float("inPosition", 2, 4, 0, &position[0]),
	};
	glu::draw(getContext().getRenderContext(), program, DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

	glu::readPixels(getContext().getRenderContext(), 0, 0, renderedFrame.getAccess());

	tcu::RGBA pixel = renderedFrame.getPixel(0, 0);

	passed = (pixel == tcu::RGBA(m_expectedColor));

	unbind(binding);

	if (!passed)
	{
		return LayoutBindingTestResult(passed,
									   generateLog(String("drawTest failed"), m_expectedColor, pixel.getPacked()));
	}

	return true;
}